

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O0

void __thiscall
Qentem::BigInt<unsigned_int,_1024U>::Add
          (BigInt<unsigned_int,_1024U> *this,uint number,SizeT32 index)

{
  uint uVar1;
  SizeT32 SVar2;
  uint local_18;
  uint tmp;
  SizeT32 index_local;
  uint number_local;
  BigInt<unsigned_int,_1024U> *this_local;
  
  local_18 = index;
  tmp = number;
  if (number != 0) {
    for (; (SVar2 = MaxIndex(), local_18 <= SVar2 &&
           (uVar1 = this->storage_[local_18],
           this->storage_[local_18] = tmp + this->storage_[local_18],
           this->storage_[local_18] <= uVar1)); local_18 = local_18 + 1) {
      tmp = 1;
    }
    SVar2 = MaxIndex();
    if (SVar2 < local_18) {
      this->index_ = 0;
    }
    else if (this->index_ < local_18) {
      this->index_ = local_18;
    }
  }
  return;
}

Assistant:

void Add(Number_T number, SizeT32 index = 0U) noexcept {
        if (number != 0) {
            while (index <= MaxIndex()) {
                const Number_T tmp = storage_[index];
                storage_[index] += number;

                if (storage_[index] > tmp) {
                    break;
                }

                // Overflow.
                number = Number_T{1};
                ++index;
            }

            if (index > MaxIndex()) {
                index_ = 0;
            } else if (index > index_) {
                index_ = index;
            }
        }
    }